

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O1

bool __thiscall draco::MetadataDecoder::DecodeMetadata(MetadataDecoder *this,Metadata *metadata)

{
  pointer pMVar1;
  int iVar2;
  bool bVar3;
  _Head_base<0UL,_draco::Metadata_*,_false> metadata_00;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  uint32_t num_entries;
  uint32_t num_sub_metadata;
  string sub_metadata_name;
  vector<MetadataTuple,_std::allocator<MetadataTuple>_> metadata_stack;
  _Head_base<0UL,_draco::Metadata_*,_false> local_90;
  uint local_84;
  unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> local_80;
  string local_78;
  vector<MetadataTuple,_std::allocator<MetadataTuple>_> local_58;
  Metadata *local_38;
  
  local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78.field_2._M_allocated_capacity._0_4_ = 0;
  local_78._M_string_length = (size_type)metadata;
  std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
            (&local_58,(value_type *)&local_78);
  bVar6 = local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (bVar6) {
LAB_00137922:
    if (local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return bVar6;
  }
  do {
    pMVar1 = local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    local_38 = local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].parent_metadata;
    metadata_00._M_head_impl =
         local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].decoded_metadata;
    iVar2 = local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].level;
    local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
    if (local_38 != (Metadata *)0x0) {
      if (1000 < iVar2) goto LAB_00137922;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity._0_4_ =
           local_78.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      bVar3 = DecodeName(this,&local_78);
      if (bVar3) {
        metadata_00._M_head_impl = (Metadata *)operator_new(0x60);
        (((_Rb_tree_header *)((long)metadata_00._M_head_impl + 8))->_M_header)._M_color = _S_red;
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x10) = (_Base_ptr)0x0;
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x18) =
             (_Base_ptr)((long)metadata_00._M_head_impl + 8);
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x20) =
             (_Base_ptr)((long)metadata_00._M_head_impl + 8);
        *(size_t *)((long)metadata_00._M_head_impl + 0x28) = 0;
        (((_Rb_tree_header *)((long)metadata_00._M_head_impl + 0x38))->_M_header)._M_color = _S_red;
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x40) = (_Base_ptr)0x0;
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x48) =
             (_Base_ptr)((long)metadata_00._M_head_impl + 0x38);
        *(_Base_ptr *)((long)metadata_00._M_head_impl + 0x50) =
             (_Base_ptr)((long)metadata_00._M_head_impl + 0x38);
        *(size_t *)((long)metadata_00._M_head_impl + 0x58) = 0;
        local_90._M_head_impl = (Metadata *)0x0;
        local_80._M_t.super___uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_>.
        _M_t.super__Tuple_impl<0UL,_draco::Metadata_*,_std::default_delete<draco::Metadata>_>.
        super__Head_base<0UL,_draco::Metadata_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::Metadata,_std::default_delete<draco::Metadata>,_true,_true>)
             (__uniq_ptr_data<draco::Metadata,_std::default_delete<draco::Metadata>,_true,_true>)
             metadata_00._M_head_impl;
        bVar3 = Metadata::AddSubMetadata(local_38,&local_78,&local_80);
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  (&local_80);
        std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>::~unique_ptr
                  ((unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *)&local_90);
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                                 local_78.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar3 == false) goto LAB_00137922;
    }
    if ((_Head_base<0UL,_draco::Metadata_*,_false>)metadata_00._M_head_impl ==
        (_Head_base<0UL,_draco::Metadata_*,_false>)0x0) goto LAB_00137922;
    local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
    bVar3 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>(1,(uint *)&local_90,this->buffer_);
    if (!bVar3) goto LAB_00137922;
    if ((uint)local_90._M_head_impl != 0) {
      uVar4 = 0;
      do {
        bVar3 = DecodeEntry(this,metadata_00._M_head_impl);
        if (!bVar3) goto LAB_00137922;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uint)local_90._M_head_impl);
    }
    local_84 = 0;
    bVar3 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>(1,&local_84,this->buffer_);
    if ((!bVar3) ||
       (uVar5 = (ulong)local_84, this->buffer_->data_size_ - this->buffer_->pos_ < (long)uVar5))
    goto LAB_00137922;
    if (local_84 != 0) {
      bVar6 = local_38 == (Metadata *)0x0;
      do {
        local_78._M_string_length = 0;
        local_78._M_dataplus._M_p = (pointer)metadata_00._M_head_impl;
        local_78.field_2._M_allocated_capacity._0_4_ = (iVar2 + 1) - (uint)bVar6;
        std::vector<MetadataTuple,_std::allocator<MetadataTuple>_>::push_back
                  (&local_58,(value_type *)&local_78);
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    bVar6 = local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_58.super__Vector_base<MetadataTuple,_std::allocator<MetadataTuple>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar6) goto LAB_00137922;
  } while( true );
}

Assistant:

bool MetadataDecoder::DecodeMetadata(Metadata *metadata) {
  // Limit metadata nesting depth to avoid stack overflow in destructor.
  constexpr int kMaxSubmetadataLevel = 1000;

  struct MetadataTuple {
    Metadata *parent_metadata;
    Metadata *decoded_metadata;
    int level;
  };
  std::vector<MetadataTuple> metadata_stack;
  metadata_stack.push_back({nullptr, metadata, 0});
  while (!metadata_stack.empty()) {
    const MetadataTuple mp = metadata_stack.back();
    metadata_stack.pop_back();
    metadata = mp.decoded_metadata;

    if (mp.parent_metadata != nullptr) {
      if (mp.level > kMaxSubmetadataLevel) {
        return false;
      }
      std::string sub_metadata_name;
      if (!DecodeName(&sub_metadata_name)) {
        return false;
      }
      std::unique_ptr<Metadata> sub_metadata =
          std::unique_ptr<Metadata>(new Metadata());
      metadata = sub_metadata.get();
      if (!mp.parent_metadata->AddSubMetadata(sub_metadata_name,
                                              std::move(sub_metadata))) {
        return false;
      }
    }
    if (metadata == nullptr) {
      return false;
    }

    uint32_t num_entries = 0;
    if (!DecodeVarint(&num_entries, buffer_)) {
      return false;
    }
    for (uint32_t i = 0; i < num_entries; ++i) {
      if (!DecodeEntry(metadata)) {
        return false;
      }
    }
    uint32_t num_sub_metadata = 0;
    if (!DecodeVarint(&num_sub_metadata, buffer_)) {
      return false;
    }
    if (num_sub_metadata > buffer_->remaining_size()) {
      // The decoded number of metadata items is unreasonably high.
      return false;
    }
    for (uint32_t i = 0; i < num_sub_metadata; ++i) {
      metadata_stack.push_back(
          {metadata, nullptr, mp.parent_metadata ? mp.level + 1 : mp.level});
    }
  }
  return true;
}